

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_protocol.cpp
# Opt level: O3

bool __thiscall
udpdiscovery::Packet::Serialize(Packet *this,ProtocolVersion protocol_version,string *buffer_out)

{
  bool bVar1;
  BufferView buffer_view;
  BufferView local_10;
  
  if (protocol_version == kProtocolVersion1) {
    if ((this->user_data_)._M_string_length < 0x1001) goto LAB_001022b4;
  }
  else if ((protocol_version != kProtocolVersion0) || ((this->user_data_)._M_string_length < 0x8001)
          ) {
LAB_001022b4:
    local_10.parsed_ = 0;
    local_10.buffer_ = buffer_out;
    bVar1 = Serialize(this,protocol_version,kSerialize,&local_10);
    return bVar1;
  }
  return false;
}

Assistant:

bool Packet::Serialize(ProtocolVersion protocol_version,
                       std::string& buffer_out) {
  if (protocol_version == kProtocolVersion0) {
    if (user_data_.size() > kMaxUserDataSizeV0) {
      return false;
    }
  } else if (protocol_version == kProtocolVersion1) {
    if (user_data_.size() > kMaxUserDataSizeV1) {
      return false;
    }
  }

  impl::BufferView buffer_view(&buffer_out);
  return Serialize(protocol_version, impl::kSerialize, &buffer_view);
}